

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_tpl_varnames_h.cc
# Opt level: O0

string * WrapWithGuard(string *output_file,string *header_entries)

{
  allocator local_1a9;
  string local_1a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168 [39];
  allocator local_141;
  string local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [39];
  allocator local_d9;
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [35];
  undefined1 local_75;
  allocator local_61;
  string local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [8];
  string guard;
  string *header_entries_local;
  string *output_file_local;
  string *out;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_60,"TPL_",&local_61);
  std::operator+(local_40,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_60);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)&local_61);
  ConvertToIdentifier(local_40);
  std::__cxx11::string::append((char *)local_40);
  local_75 = 0;
  std::__cxx11::string::string((string *)output_file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"#ifndef ",&local_d9);
  std::operator+(local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8);
  std::operator+(local_98,(char *)local_b8);
  std::__cxx11::string::append((string *)output_file);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_140,"#define ",&local_141);
  std::operator+(local_120,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140);
  std::operator+(local_100,(char *)local_120);
  std::__cxx11::string::append((string *)output_file);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator((allocator<char> *)&local_141);
  std::__cxx11::string::append((string *)output_file);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"\n#endif  // ",&local_1a9);
  std::operator+(local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8);
  std::operator+(local_168,(char *)local_188);
  std::__cxx11::string::append((string *)output_file);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_188);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  local_75 = 1;
  std::__cxx11::string::~string((string *)local_40);
  return output_file;
}

Assistant:

static string WrapWithGuard(const string& output_file,
                            const string& header_entries) {
  string guard(string("TPL_") + output_file);
  ConvertToIdentifier(&guard);
  guard.append("_H_");

  string out;
  out.append(string("#ifndef ") + guard + "\n");
  out.append(string("#define ") + guard + "\n\n");

  // Now append the header-entry info to the intro above
  out.append(header_entries);

  out.append(string("\n#endif  // ") + guard + "\n");
  return out;
}